

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tspm.cpp
# Opt level: O0

void __thiscall pg::TSPMSolver::Prog(TSPMSolver *this,int *dst,int *src,int d,int pl)

{
  int iVar1;
  bool bVar2;
  uint local_30;
  int v;
  int carry;
  int i;
  int pl_local;
  int d_local;
  int *src_local;
  int *dst_local;
  TSPMSolver *this_local;
  
  v = pl;
  if (src[pl] == -1) {
    dst[pl] = -1;
  }
  else {
    for (; v < d; v = v + 2) {
      dst[v] = 0;
    }
    bVar2 = d == v;
    for (; local_30 = (uint)bVar2, (long)v < this->k; v = v + 2) {
      iVar1 = src[v] + local_30;
      bVar2 = iVar1 <= this->counts[v];
      if (bVar2) {
        dst[v] = iVar1;
      }
      else {
        dst[v] = 0;
      }
      bVar2 = !bVar2;
    }
    if (local_30 != 0) {
      dst[pl] = -1;
    }
  }
  return;
}

Assistant:

void
TSPMSolver::Prog(int *dst, int *src, int d, int pl)
{
    // check if top
    if (src[pl] == -1) {
        dst[pl] = -1;
        return;
    }

    // set every value lower than <d> to 0.
    int i = pl;
    for (; i<d; i+=2) dst[i] = 0;

    int carry = (d == i) ? 1 : 0; // only increase if <d> has parity <pl>

    for (; i<k; i+=2) {
        // increase or copy for same parity
        int v = src[i] + carry;
        if (v > counts[i]) {
            dst[i] = 0;
            carry = 1;
        } else {
            dst[i] = v;
            carry = 0;
        }
    }

    // check if top
    if (carry) dst[pl] = -1;
}